

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::SetParallelLevel
          (cmCTestMultiProcessHandler *this,optional<unsigned_long> level)

{
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  unsigned_long *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  unsigned_long local_98;
  unsigned_long pc;
  string local_88;
  undefined1 local_68 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fakeProcessorCount;
  unsigned_long processorCount;
  SystemInformation local_28;
  SystemInformation info;
  cmCTestMultiProcessHandler *this_local;
  optional<unsigned_long> level_local;
  
  (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  *(ulong *)&(this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged =
       CONCAT71(level_local.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_payload._M_value._1_7_,
                level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged);
  info.Implementation = (SystemInformationImplementation *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->ParallelLevel);
  if (!bVar1) {
    cmsys::SystemInformation::SystemInformation(&local_28);
    cmsys::SystemInformation::RunCPUCheck(&local_28);
    uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&local_28);
    fakeProcessorCount.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._32_8_ = ZEXT48(uVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"__CTEST_FAKE_PROCESSOR_COUNT_FOR_TESTING",
               (allocator<char> *)((long)&pc + 7));
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pc + 7));
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_68);
    if (bVar1) {
      local_98 = 0;
      pbVar3 = std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_68);
      bVar1 = cmStrToULong(pbVar3,&local_98);
      if (bVar1) {
        fakeProcessorCount.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._32_8_ = local_98;
      }
      else {
        pbVar3 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_68);
        std::operator+(&local_b8,"Failed to parse fake processor count: ",pbVar3);
        cmSystemTools::Error(&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_68);
    puVar4 = std::max<unsigned_long>
                       (&(anonymous_namespace)::kParallelLevelMinimum,
                        (unsigned_long *)
                        &fakeProcessorCount.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_engaged);
    this->ParallelLevelDefault = *puVar4;
    cmsys::SystemInformation::~SystemInformation(&local_28);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetParallelLevel(cm::optional<size_t> level)
{
  this->ParallelLevel = level;

  if (!this->ParallelLevel) {
    // '-j' was given with no value.  Limit by number of processors.
    cmsys::SystemInformation info;
    info.RunCPUCheck();
    unsigned long processorCount = info.GetNumberOfLogicalCPU();

    if (cm::optional<std::string> fakeProcessorCount =
          cmSystemTools::GetEnvVar(
            "__CTEST_FAKE_PROCESSOR_COUNT_FOR_TESTING")) {
      unsigned long pc = 0;
      if (cmStrToULong(*fakeProcessorCount, &pc)) {
        processorCount = pc;
      } else {
        cmSystemTools::Error("Failed to parse fake processor count: " +
                             *fakeProcessorCount);
      }
    }

    this->ParallelLevelDefault =
      std::max(kParallelLevelMinimum, processorCount);
  }
}